

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O1

void depspawn::wait_for_subtasks(bool priority)

{
  TaskPool *this;
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  Observer o;
  Workitem *local_18;
  Workitem *local_10;
  
  this = internal::TP;
  local_18 = *(Workitem **)(in_FS_OFFSET + -8);
  if (local_18 == (Workitem *)0x0) {
    if (internal::TP != (TaskPool *)0x0) {
      uVar4 = 0;
      do {
        do {
          local_10 = (Workitem *)0x10e15b;
          bVar2 = internal::TaskPool::try_run(this);
        } while (bVar2);
      } while ((this->busy_threads_).super___atomic_base<int>._M_i != 0);
      this->finish_ = true;
      do {
        do {
        } while ((this->thread_pool_).ready_ != false);
      } while ((this->thread_pool_).count_ != 0);
      uVar1 = (anonymous_namespace)::worklist;
      if ((anonymous_namespace)::worklist != 0) {
        for (; uVar3 = internal::Workitem::Pool._32_8_, uVar1 != 0; uVar1 = *(ulong *)(uVar1 + 0x18)
            ) {
          uVar4 = uVar1;
        }
        do {
          *(ulong *)(uVar4 + 0x18) = uVar3;
          LOCK();
          bVar2 = uVar3 != internal::Workitem::Pool._32_8_;
          uVar1 = (uVar3 & 0xffff000000000000) + 0x1000000000000 | (anonymous_namespace)::worklist;
          if (bVar2) {
            uVar3 = internal::Workitem::Pool._32_8_;
            uVar1 = internal::Workitem::Pool._32_8_;
          }
          internal::Workitem::Pool._32_8_ = uVar1;
          UNLOCK();
        } while (bVar2);
      }
      LOCK();
      (anonymous_namespace)::worklist = 0;
      UNLOCK();
    }
    return;
  }
  local_10 = local_18;
  Observer::~Observer((Observer *)&local_18);
  return;
}

Assistant:

void wait_for_subtasks(bool priority)
  {
    internal::Workitem * cur_father = enum_thr_spec_father;
    
    //fprintf(stderr, "WFS %s\n", (cur_father == nullptr) ? "0" : "nested");
    
    if (cur_father == nullptr) {
      wait_for_all();
    } else {
      Observer o(priority, cur_father);
    }
  }